

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextInput.cpp
# Opt level: O3

bool __thiscall cursespp::TextInput::Write(TextInput *this,string *key)

{
  string *psVar1;
  utf8 *this_00;
  size_type sVar2;
  pointer pcVar3;
  int iVar4;
  wchar_t *pwVar5;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var6;
  back_insert_iterator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  in_RCX;
  ulong uVar7;
  int iVar8;
  size_t sVar9;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var10;
  const_iterator it;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  size_t local_70;
  wchar_t local_68;
  undefined4 uStack_64;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_58._M_current = (key->_M_dataplus)._M_p;
  if ((long)key->_M_string_length < 1) {
    iVar4 = 0;
  }
  else {
    _Var10._M_current = local_58._M_current + key->_M_string_length;
    iVar4 = 0;
    do {
      utf8::next<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>(&local_58,_Var10);
      iVar4 = iVar4 + 1;
    } while (local_58._M_current < _Var10._M_current);
  }
  if (iVar4 == 1) {
    if (this->inputMode != InputRaw) {
      if (this->truncate == true) {
        local_70 = 0;
        local_68 = L'\0';
        this_00 = (utf8 *)(this->buffer)._M_dataplus._M_p;
        local_78._M_current = (char *)&local_68;
        utf8::
        utf8to16<std::back_insert_iterator<std::__cxx11::wstring>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  (this_00,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            )(this_00 + (this->buffer)._M_string_length),
                   (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )&local_78,in_RCX);
        iVar4 = wcswidth((wchar_t *)local_78._M_current,local_70);
        sVar2 = (this->buffer)._M_string_length;
        if ((wchar_t *)local_78._M_current != &local_68) {
          operator_delete(local_78._M_current,CONCAT44(uStack_64,local_68) * 4 + 4);
        }
        iVar8 = (int)sVar2;
        if (0 < iVar4) {
          iVar8 = iVar4;
        }
        iVar4 = (*(this->super_Window).super_IWindow.super_IOrderable._vptr_IOrderable[0x16])(this);
        if (iVar4 <= iVar8) {
          return false;
        }
      }
      psVar1 = &this->buffer;
      if ((this->buffer)._M_string_length == 0) {
LAB_00180e49:
        uVar7 = 0;
      }
      else {
        iVar4 = this->position;
        pwVar5 = (wchar_t *)(psVar1->_M_dataplus)._M_p;
        _Var10._M_current = (char *)pwVar5;
        local_78._M_current = (char *)pwVar5;
        if (0 < iVar4) {
          do {
            pwVar5 = (wchar_t *)(this->buffer)._M_dataplus._M_p;
            _Var10._M_current = (char *)((long)pwVar5 + (this->buffer)._M_string_length);
            if (local_78._M_current == _Var10._M_current) goto LAB_00180e40;
            utf8::unchecked::next<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                      (&local_78);
            iVar4 = iVar4 + -1;
          } while (iVar4 != 0);
          pwVar5 = (wchar_t *)(psVar1->_M_dataplus)._M_p;
          _Var10._M_current = local_78._M_current;
        }
LAB_00180e40:
        uVar7 = (long)_Var10._M_current - (long)pwVar5;
        if (uVar7 == 0xffffffffffffffff) goto LAB_00180e49;
      }
      sVar9 = 0;
      std::__cxx11::string::replace((ulong)psVar1,uVar7,(char *)0x0,(ulong)(key->_M_dataplus)._M_p);
      local_78._M_current = (this->buffer)._M_dataplus._M_p;
      sVar2 = (this->buffer)._M_string_length;
      if (0 < (long)sVar2) {
        _Var10._M_current = local_78._M_current + sVar2;
        sVar9 = 0;
        do {
          utf8::next<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                    (&local_78,_Var10);
          sVar9 = sVar9 + 1;
        } while (local_78._M_current < _Var10._M_current);
      }
      this->bufferLength = sVar9;
      this->position = this->position + 1;
      goto LAB_00180eff;
    }
  }
  else {
    if (iVar4 < 2) {
      return false;
    }
    if (this->inputMode != InputRaw) {
      return false;
    }
  }
  _Var6 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                    ((this->rawBlacklist).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (this->rawBlacklist).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,key);
  if (_Var6._M_current !=
      (this->rawBlacklist).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    return false;
  }
  std::__cxx11::string::_M_assign((string *)&this->buffer);
  this->bufferLength = (long)iVar4;
  this->position = iVar4;
LAB_00180eff:
  pcVar3 = (this->buffer)._M_dataplus._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar3,pcVar3 + (this->buffer)._M_string_length);
  sigslot::
  signal2<cursespp::TextInput_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>
  ::operator()(&this->TextChanged,this,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  (*(this->super_Window).super_IWindow.super_IOrderable._vptr_IOrderable[5])(this);
  return true;
}

Assistant:

bool TextInput::Write(const std::string& key) {
    /* one character at a time. if it's more than one character, we're
    dealing with an escape sequence and should not print it unless
    the input mode allows for modifiers */
    int len = u8len(key);
    if (len == 1 || (len > 1 && this->inputMode == InputRaw)) {
        if (this->inputMode == InputRaw) {
            auto& bl = this->rawBlacklist;
            if (std::find(bl.begin(), bl.end(), key) != bl.end()) {
                return false;
            }
            this->buffer = key;
            this->bufferLength = len;
            this->position = len;
        }
        else {
            if (truncate) {
                int cols = u8cols(this->buffer);
                if (cols >= this->GetWidth()) {
                    return false;
                }
            }

            size_t offset = u8offset(this->buffer, this->position);
            offset = (offset == std::string::npos) ? 0 : offset;
            this->buffer.insert(offset, key);
            this->bufferLength = u8len(buffer);
            this->position += len;
        }

        this->TextChanged(this, this->buffer);
        this->Redraw();
        return true;
    }

    return false;
}